

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_decomposition.hpp
# Opt level: O0

void __thiscall
polar::
polar_decomposition<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
          (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *A,matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *U,matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *H,double rtol,size_t max_iter)

{
  bool bVar1;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *input;
  long in_RCX;
  matrix_expression<_bd1e8544_> *in_RDX;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RSI;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  value_type vVar2;
  value_type vVar3;
  double dVar4;
  double dVar5;
  value_type vVar6;
  value_type beta;
  value_type alpha;
  value_type gamma;
  bool close_to_convergence;
  size_t count;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  X;
  matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd70;
  byte in_stack_fffffffffffffd77;
  matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffd78;
  uint7 in_stack_fffffffffffffd80;
  byte in_stack_fffffffffffffd87;
  matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffd88;
  size_type in_stack_fffffffffffffd90;
  size_type in_stack_fffffffffffffd98;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffda0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined1 preserve;
  size_type in_stack_fffffffffffffdc0;
  size_type in_stack_fffffffffffffdc8;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffdd0;
  long local_58;
  
  preserve = (undefined1)((ulong)in_stack_fffffffffffffdb8 >> 0x38);
  input = (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)boost::numeric::ublas::
             matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::size1(in_RDI);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::size2(in_RDI);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::resize(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
           (bool)preserve);
  boost::numeric::ublas::
  matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
  ::
  assign<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd68);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::size1(in_RDI);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::size2(in_RDI);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::resize(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
           (bool)preserve);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::size1(in_RDI);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::size2(in_RDI);
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  local_58 = 0;
  bVar1 = false;
  while( true ) {
    boost::numeric::ublas::
    matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
    ::
    assign<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    detail::
    invert<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              (input,in_RSI);
    if (!bVar1) {
      boost::numeric::ublas::
      norm_1<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                (in_stack_fffffffffffffd78);
      vVar2 = boost::numeric::ublas::matrix_scalar_unary::operator_cast_to_double
                        ((matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                          *)0x119ace);
      boost::numeric::ublas::
      norm_inf<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                (in_stack_fffffffffffffd78);
      vVar3 = boost::numeric::ublas::matrix_scalar_unary::operator_cast_to_double
                        ((matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_inf<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                          *)0x119afa);
      dVar4 = sqrt(vVar2 * vVar3);
      boost::numeric::ublas::
      matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_inf<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
      ::~matrix_scalar_unary
                ((matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_inf<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      boost::numeric::ublas::
      matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
      ::~matrix_scalar_unary
                ((matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      boost::numeric::ublas::
      norm_1<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                (in_stack_fffffffffffffd78);
      vVar2 = boost::numeric::ublas::matrix_scalar_unary::operator_cast_to_double
                        ((matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                          *)0x119b6a);
      boost::numeric::ublas::
      norm_inf<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
                (in_stack_fffffffffffffd78);
      vVar3 = boost::numeric::ublas::matrix_scalar_unary::operator_cast_to_double
                        ((matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_inf<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                          *)0x119b96);
      dVar5 = sqrt(vVar2 * vVar3);
      boost::numeric::ublas::
      matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_inf<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
      ::~matrix_scalar_unary
                ((matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_inf<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      boost::numeric::ublas::
      matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
      ::~matrix_scalar_unary
                ((matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      sqrt(dVar5 / dVar4);
    }
    boost::numeric::ublas::operator*
              ((double *)in_stack_fffffffffffffd88,
               (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    boost::numeric::ublas::
    trans<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              (in_stack_fffffffffffffd78);
    boost::numeric::ublas::operator*
              ((double *)in_stack_fffffffffffffd88,
               (matrix_expression<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>_>
                *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    boost::numeric::ublas::operator+
              ((matrix_expression<boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
                *)in_stack_fffffffffffffd88,
               (matrix_expression<boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
                *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    boost::numeric::ublas::operator*
              ((double *)in_stack_fffffffffffffd88,
               (matrix_expression<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::scalar_plus<double,_double>_>_>
                *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    boost::numeric::ublas::
    matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
    ::
    assign<boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_identity<double>>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::scalar_plus<double,double>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
              ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
               (matrix_expression<boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::scalar_plus<double,_double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
                *)in_stack_fffffffffffffd68);
    boost::numeric::ublas::
    matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::scalar_plus<double,_double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
    ::~matrix_binary_scalar1
              ((matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::scalar_plus<double,_double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
                *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    boost::numeric::ublas::
    matrix_binary<boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::scalar_plus<double,_double>_>
    ::~matrix_binary((matrix_binary<boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::scalar_plus<double,_double>_>
                      *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    boost::numeric::ublas::
    matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
    ::~matrix_binary_scalar1
              ((matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
                *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    boost::numeric::ublas::
    matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>
    ::~matrix_unary2((matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>
                      *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    boost::numeric::ublas::
    matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
    ::~matrix_binary_scalar1
              ((matrix_binary_scalar1<const_double,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
                *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    boost::numeric::ublas::operator-
              (in_stack_fffffffffffffd88,
               (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    boost::numeric::ublas::
    norm_1<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
              ((matrix_expression<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>
                *)in_stack_fffffffffffffd78);
    vVar6 = boost::numeric::ublas::matrix_scalar_unary::operator_cast_to_double
                      ((matrix_scalar_unary<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>_>
                        *)0x119e1a);
    dVar4 = in_XMM0_Qa;
    boost::numeric::ublas::
    norm_1<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              (in_stack_fffffffffffffd78);
    vVar2 = boost::numeric::ublas::matrix_scalar_unary::operator_cast_to_double
                      ((matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                        *)0x119e55);
    in_stack_fffffffffffffd88 =
         (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
          *)(dVar4 * vVar2);
    boost::numeric::ublas::
    matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
    ::~matrix_scalar_unary
              ((matrix_scalar_unary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    boost::numeric::ublas::
    matrix_scalar_unary<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>_>
    ::~matrix_scalar_unary
              ((matrix_scalar_unary<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>,_boost::numeric::ublas::matrix_norm_1<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    boost::numeric::ublas::
    matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>
    ::~matrix_binary((matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>
                      *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    if ((vVar6 < (double)in_stack_fffffffffffffd88) ||
       ((in_RCX != 0 && (local_58 = local_58 + 1, local_58 == in_RCX)))) break;
    in_stack_fffffffffffffd77 = 0;
    in_stack_fffffffffffffd87 = in_stack_fffffffffffffd77;
    if (!bVar1) {
      boost::numeric::ublas::operator-
                (in_stack_fffffffffffffd88,
                 (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                  *)(ulong)in_stack_fffffffffffffd80);
      boost::numeric::ublas::
      norm_frobenius<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_minus<double,double>>>
                ((matrix_expression<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>
                  *)in_stack_fffffffffffffd78);
      in_stack_fffffffffffffd78 =
           (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
            *)boost::numeric::ublas::matrix_scalar_unary::operator_cast_to_double
                        ((matrix_scalar_unary<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>,_boost::numeric::ublas::matrix_norm_frobenius<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>_>
                          *)0x11a079);
      in_stack_fffffffffffffd77 = (double)in_stack_fffffffffffffd78 < 0.01;
      in_stack_fffffffffffffd87 = in_stack_fffffffffffffd77;
      boost::numeric::ublas::
      matrix_scalar_unary<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>,_boost::numeric::ublas::matrix_norm_frobenius<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>_>
      ::~matrix_scalar_unary
                ((matrix_scalar_unary<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>,_boost::numeric::ublas::matrix_norm_frobenius<boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      boost::numeric::ublas::
      matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>
      ::~matrix_binary((matrix_binary<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_minus<double,_double>_>
                        *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    }
    if ((in_stack_fffffffffffffd77 & 1) != 0) {
      bVar1 = true;
    }
  }
  boost::numeric::ublas::
  trans<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            (in_stack_fffffffffffffd78);
  boost::numeric::ublas::
  prod<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_identity<double>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            ((matrix_expression<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>_>
              *)in_stack_fffffffffffffd78,
             (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  boost::numeric::ublas::
  trans<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            (in_stack_fffffffffffffd78);
  boost::numeric::ublas::
  prod<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const,boost::numeric::ublas::scalar_identity<double>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
            ((matrix_expression<boost::numeric::ublas::matrix_unary2<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>_>
              *)in_stack_fffffffffffffd78,
             (matrix_expression<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  boost::numeric::ublas::operator+
            ((matrix_expression<boost::numeric::ublas::matrix_matrix_binary<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>_>
              *)in_stack_fffffffffffffd88,
             (matrix_expression<boost::numeric::ublas::matrix_matrix_binary<boost::numeric::ublas::matrix_unary2<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix_unary2<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>_>
              *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  boost::numeric::ublas::operator*
            ((double *)in_stack_fffffffffffffd88,
             (matrix_expression<_334cff88_> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  boost::numeric::ublas::
  matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>
  ::
  assign<boost::numeric::ublas::matrix_binary_scalar1<double_const,boost::numeric::ublas::matrix_binary<boost::numeric::ublas::matrix_matrix_binary<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_identity<double>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,boost::numeric::ublas::scalar_identity<double>>,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double___umeric::ublas::scalar_plus<double,double>>,boost::numeric::ublas::scalar_multiplies<double,double>>>
            ((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),in_RDX);
  boost::numeric::ublas::matrix_binary_scalar1<$6a8c8cdc$>::~matrix_binary_scalar1
            ((matrix_binary_scalar1<_6a8c8cdc_> *)
             CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  boost::numeric::ublas::matrix_binary<$120bb3f2$>::~matrix_binary
            ((matrix_binary<_120bb3f2_> *)
             CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  boost::numeric::ublas::
  matrix_matrix_binary<boost::numeric::ublas::matrix_unary2<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix_unary2<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>
  ::~matrix_matrix_binary
            ((matrix_matrix_binary<boost::numeric::ublas::matrix_unary2<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix_unary2<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>
              *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  boost::numeric::ublas::
  matrix_unary2<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>
  ::~matrix_unary2((matrix_unary2<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>
                    *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  boost::numeric::ublas::
  matrix_matrix_binary<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>
  ::~matrix_matrix_binary
            ((matrix_matrix_binary<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::matrix_matrix_prod<boost::numeric::ublas::matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_double>_>
              *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  boost::numeric::ublas::
  matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>
  ::~matrix_unary2((matrix_unary2<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_boost::numeric::ublas::scalar_identity<double>_>
                    *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::~matrix((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  return;
}

Assistant:

void polar_decomposition(Matrix_in const& A, Matrix_out& U, Matrix_out& H,
        double rtol = 1.0e-8, std::size_t max_iter = 0)
{
    typedef typename Matrix_out::value_type value_type;

    BOOST_ASSERT(A.size1() == A.size2());

    U.resize(A.size1(), A.size2());
    U.assign(A);
    H.resize(A.size1(), A.size2());
    Matrix_out X(A.size1(), A.size2());

    std::size_t count = 0;
    bool close_to_convergence = false;

    while (true)
    {
        X.assign(U);
        detail::invert(X, H);
        value_type gamma = 1.0;

        if (!close_to_convergence)
        {
            value_type alpha = std::sqrt(norm_1(X) * norm_inf(X));
            value_type beta  = std::sqrt(norm_1(H) * norm_inf(H));
            gamma = std::sqrt(beta / alpha);
        }

        U.assign(0.5 * (gamma * X + 1.0 / gamma * trans(H)));

        if (norm_1(X - U) < rtol * norm_1(X))
            break;

        if (max_iter != 0 && ++count == max_iter)
            break;

        if (!close_to_convergence && norm_frobenius(X - U) < 1.0e-2)
            close_to_convergence = true;
    }

    H.assign(0.5 * (prod(trans(U), A) + prod(trans(A), U)));
}